

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void loop_restoration_write_sb_coeffs
               (AV1_COMMON *cm,MACROBLOCKD *xd,int runit_idx,aom_writer *w,int plane,
               FRAME_COUNTS *counts)

{
  int iVar1;
  aom_writer *w_00;
  WienerInfo *wiener_info;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  RestorationType unit_rtype;
  SgrprojInfo *ref_sgrproj_info;
  WienerInfo *ref_wiener_info;
  int wiener_win;
  RestorationType frame_rtype;
  RestorationInfo *rsi;
  RestorationUnitInfo *rui;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar2;
  int symb;
  
  iVar1 = *(int *)(in_RDI + 0x5a20 + (long)in_R8D * 0x40);
  w_00 = (aom_writer *)(in_RSI + 0x1ff0 + (long)in_R8D * 0x20);
  wiener_info = (WienerInfo *)(in_RSI + 0x2050 + (long)in_R8D * 0xc);
  iVar2 = *(int *)(*(long *)(in_RDI + (long)in_R8D * 0x40 + 0x5a38) + (long)in_EDX * 0x40);
  symb = (int)((ulong)wiener_info >> 0x20);
  if (iVar1 == 3) {
    aom_write_symbol(w_00,symb,(aom_cdf_prob *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
    if (iVar2 == 1) {
      write_wiener_filter((int)((ulong)w_00 >> 0x20),wiener_info,(WienerInfo *)0x100000001,
                          (aom_writer *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    else if (iVar2 == 2) {
      write_sgrproj_filter((SgrprojInfo *)w_00,(SgrprojInfo *)wiener_info,(aom_writer *)0x200000002)
      ;
    }
  }
  else if (iVar1 == 1) {
    aom_write_symbol(w_00,symb,(aom_cdf_prob *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
    if (iVar2 != 0) {
      write_wiener_filter((int)((ulong)w_00 >> 0x20),wiener_info,
                          (WienerInfo *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                          (aom_writer *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
  }
  else if ((iVar1 == 2) &&
          (aom_write_symbol(w_00,symb,(aom_cdf_prob *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c), iVar2 != 0)) {
    write_sgrproj_filter
              ((SgrprojInfo *)w_00,(SgrprojInfo *)wiener_info,
               (aom_writer *)CONCAT44(iVar2,in_stack_ffffffffffffffa0));
  }
  return;
}

Assistant:

static inline void loop_restoration_write_sb_coeffs(
    const AV1_COMMON *const cm, MACROBLOCKD *xd, int runit_idx,
    aom_writer *const w, int plane, FRAME_COUNTS *counts) {
  const RestorationUnitInfo *rui = &cm->rst_info[plane].unit_info[runit_idx];
  const RestorationInfo *rsi = cm->rst_info + plane;
  RestorationType frame_rtype = rsi->frame_restoration_type;
  assert(frame_rtype != RESTORE_NONE);

  (void)counts;
  assert(!cm->features.all_lossless);

  const int wiener_win = (plane > 0) ? WIENER_WIN_CHROMA : WIENER_WIN;
  WienerInfo *ref_wiener_info = &xd->wiener_info[plane];
  SgrprojInfo *ref_sgrproj_info = &xd->sgrproj_info[plane];
  RestorationType unit_rtype = rui->restoration_type;

  if (frame_rtype == RESTORE_SWITCHABLE) {
    aom_write_symbol(w, unit_rtype, xd->tile_ctx->switchable_restore_cdf,
                     RESTORE_SWITCHABLE_TYPES);
#if CONFIG_ENTROPY_STATS
    ++counts->switchable_restore[unit_rtype];
#endif
    switch (unit_rtype) {
      case RESTORE_WIENER:
#if DEBUG_LR_COSTING
        assert(!memcmp(
            ref_wiener_info,
            &lr_ref_params[RESTORE_SWITCHABLE][plane][runit_idx].wiener_info,
            sizeof(*ref_wiener_info)));
#endif
        write_wiener_filter(wiener_win, &rui->wiener_info, ref_wiener_info, w);
        break;
      case RESTORE_SGRPROJ:
#if DEBUG_LR_COSTING
        assert(!memcmp(&ref_sgrproj_info->xqd,
                       &lr_ref_params[RESTORE_SWITCHABLE][plane][runit_idx]
                            .sgrproj_info.xqd,
                       sizeof(ref_sgrproj_info->xqd)));
#endif
        write_sgrproj_filter(&rui->sgrproj_info, ref_sgrproj_info, w);
        break;
      default: assert(unit_rtype == RESTORE_NONE); break;
    }
  } else if (frame_rtype == RESTORE_WIENER) {
    aom_write_symbol(w, unit_rtype != RESTORE_NONE,
                     xd->tile_ctx->wiener_restore_cdf, 2);
#if CONFIG_ENTROPY_STATS
    ++counts->wiener_restore[unit_rtype != RESTORE_NONE];
#endif
    if (unit_rtype != RESTORE_NONE) {
#if DEBUG_LR_COSTING
      assert(
          !memcmp(ref_wiener_info,
                  &lr_ref_params[RESTORE_WIENER][plane][runit_idx].wiener_info,
                  sizeof(*ref_wiener_info)));
#endif
      write_wiener_filter(wiener_win, &rui->wiener_info, ref_wiener_info, w);
    }
  } else if (frame_rtype == RESTORE_SGRPROJ) {
    aom_write_symbol(w, unit_rtype != RESTORE_NONE,
                     xd->tile_ctx->sgrproj_restore_cdf, 2);
#if CONFIG_ENTROPY_STATS
    ++counts->sgrproj_restore[unit_rtype != RESTORE_NONE];
#endif
    if (unit_rtype != RESTORE_NONE) {
#if DEBUG_LR_COSTING
      assert(!memcmp(
          &ref_sgrproj_info->xqd,
          &lr_ref_params[RESTORE_SGRPROJ][plane][runit_idx].sgrproj_info.xqd,
          sizeof(ref_sgrproj_info->xqd)));
#endif
      write_sgrproj_filter(&rui->sgrproj_info, ref_sgrproj_info, w);
    }
  }
}